

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.c
# Opt level: O0

SqQueue InitQueue2(SqQueue Q)

{
  SqQueue SVar1;
  ElementType *pEVar2;
  SqQueue Q_local;
  
  Q_local.base = Q._8_8_;
  pEVar2 = (ElementType *)malloc(400);
  if (pEVar2 == (ElementType *)0x0) {
    printf(anon_var_dwarf_23);
    Q_local.base = (ElementType *)0x0;
  }
  printf(anon_var_dwarf_8d);
  SVar1._8_8_ = Q_local.base;
  SVar1.base = pEVar2;
  return SVar1;
}

Assistant:

SqQueue InitQueue2(SqQueue Q){
    Q.base = (ElementType *)malloc(MAXQSIZE * sizeof(ElementType));
    if(!Q.base){
        printf("储存分配失败");
        Q.front = Q.rear = 0;
    }
    printf("构建循环队列成功");
    return Q;
}